

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,size_t escapeOffset
          )

{
  char cVar1;
  MemoryStream *pMVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  pMVar2 = is->is_;
  pcVar4 = pMVar2->src_;
  uVar3 = 0;
  iVar5 = 4;
  while (pcVar4 != pMVar2->end_) {
    cVar1 = *pcVar4;
    iVar6 = -0x30;
    if (((9 < (byte)(cVar1 - 0x30U)) && (iVar6 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar6 = -0x57, 5 < (byte)(cVar1 + 0x9fU))) break;
    uVar3 = uVar3 * 0x10 + (int)cVar1 + iVar6;
    pcVar4 = pcVar4 + 1;
    pMVar2->src_ = pcVar4;
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      return uVar3;
    }
  }
  *(undefined4 *)(this + 0x30) = 8;
  *(size_t *)(this + 0x38) = escapeOffset;
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }